

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void Catch::showHelp(CommandParser *parser)

{
  bool bVar1;
  reference this;
  type tVar2;
  ostream *poVar3;
  bool local_219;
  string local_1f8;
  string local_1d8;
  string local_1b8 [32];
  string local_198 [32];
  string local_178;
  byte local_151;
  string local_150;
  byte local_129;
  string local_128;
  Command local_108;
  OptionParser *local_d0;
  OptionParser *opt;
  __normal_iterator<const_Catch::Ptr<Catch::OptionParser>_*,_std::vector<Catch::Ptr<Catch::OptionParser>,_std::allocator<Catch::Ptr<Catch::OptionParser>_>_>_>
  local_c0;
  const_iterator it;
  undefined1 local_b0 [7];
  bool displayedSpecificOption;
  HelpOptionParser helpOpt;
  AllOptions options;
  string local_58 [32];
  long local_38;
  size_type pos;
  string exeName;
  CommandParser *parser_local;
  
  exeName.field_2._8_8_ = parser;
  CommandParser::exeName_abi_cxx11_((string *)&pos,parser);
  local_38 = std::__cxx11::string::find_last_of((char *)&pos,0x261341);
  if (local_38 != -1) {
    std::__cxx11::string::substr((ulong)local_58,(ulong)&pos);
    std::__cxx11::string::operator=((string *)&pos,local_58);
    std::__cxx11::string::~string(local_58);
  }
  AllOptions::AllOptions((AllOptions *)&helpOpt.super_OptionParser.m_minArgs);
  Options::HelpOptionParser::HelpOptionParser((HelpOptionParser *)local_b0);
  it._M_current._7_1_ = 0;
  local_c0._M_current =
       (Ptr<Catch::OptionParser> *)
       AllOptions::begin((AllOptions *)&helpOpt.super_OptionParser.m_minArgs);
  while( true ) {
    opt = (OptionParser *)AllOptions::end((AllOptions *)&helpOpt.super_OptionParser.m_minArgs);
    bVar1 = __gnu_cxx::operator!=
                      (&local_c0,
                       (__normal_iterator<const_Catch::Ptr<Catch::OptionParser>_*,_std::vector<Catch::Ptr<Catch::OptionParser>,_std::allocator<Catch::Ptr<Catch::OptionParser>_>_>_>
                        *)&opt);
    if (!bVar1) break;
    this = __gnu_cxx::
           __normal_iterator<const_Catch::Ptr<Catch::OptionParser>_*,_std::vector<Catch::Ptr<Catch::OptionParser>,_std::allocator<Catch::Ptr<Catch::OptionParser>_>_>_>
           ::operator*(&local_c0);
    local_d0 = Ptr<Catch::OptionParser>::operator*(this);
    local_129 = 0;
    local_151 = 0;
    OptionParser::find(&local_108,local_d0,(CommandParser *)exeName.field_2._8_8_);
    tVar2 = Command::operator_cast_to_function_pointer(&local_108);
    local_219 = false;
    if (tVar2 != 0) {
      OptionParser::optionNames_abi_cxx11_(&local_128,local_d0);
      local_129 = 1;
      OptionParser::optionNames_abi_cxx11_(&local_150,(OptionParser *)local_b0);
      local_151 = 1;
      local_219 = std::operator!=(&local_128,&local_150);
    }
    if ((local_151 & 1) != 0) {
      std::__cxx11::string::~string((string *)&local_150);
    }
    if ((local_129 & 1) != 0) {
      std::__cxx11::string::~string((string *)&local_128);
    }
    Command::~Command(&local_108);
    if (local_219 != false) {
      it._M_current._7_1_ = 1;
      poVar3 = std::operator<<((ostream *)&std::cout,"\n");
      OptionParser::optionNames_abi_cxx11_(&local_178,local_d0);
      poVar3 = std::operator<<(poVar3,(string *)&local_178);
      poVar3 = std::operator<<(poVar3," ");
      (*(local_d0->super_SharedImpl<Catch::IShared>).super_IShared.super_NonCopyable.
        _vptr_NonCopyable[5])(local_198);
      poVar3 = std::operator<<(poVar3,local_198);
      poVar3 = std::operator<<(poVar3,"\n\n");
      (*(local_d0->super_SharedImpl<Catch::IShared>).super_IShared.super_NonCopyable.
        _vptr_NonCopyable[6])(local_1b8);
      poVar3 = std::operator<<(poVar3,local_1b8);
      poVar3 = std::operator<<(poVar3,"\n\n");
      (*(local_d0->super_SharedImpl<Catch::IShared>).super_IShared.super_NonCopyable.
        _vptr_NonCopyable[7])(&local_1f8);
      addLineBreaks(&local_1d8,&local_1f8,0x50,2);
      poVar3 = std::operator<<(poVar3,(string *)&local_1d8);
      poVar3 = std::operator<<(poVar3,"\n");
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      std::__cxx11::string::~string((string *)&local_1d8);
      std::__cxx11::string::~string((string *)&local_1f8);
      std::__cxx11::string::~string(local_1b8);
      std::__cxx11::string::~string(local_198);
      std::__cxx11::string::~string((string *)&local_178);
    }
    __gnu_cxx::
    __normal_iterator<const_Catch::Ptr<Catch::OptionParser>_*,_std::vector<Catch::Ptr<Catch::OptionParser>,_std::allocator<Catch::Ptr<Catch::OptionParser>_>_>_>
    ::operator++(&local_c0);
  }
  if ((it._M_current._7_1_ & 1) == 0) {
    poVar3 = std::operator<<((ostream *)&std::cout,(string *)&pos);
    std::operator<<(poVar3," is a CATCH host application. Options are as follows:\n\n");
    showUsage((ostream *)&std::cout);
  }
  Options::HelpOptionParser::~HelpOptionParser((HelpOptionParser *)local_b0);
  AllOptions::~AllOptions((AllOptions *)&helpOpt.super_OptionParser.m_minArgs);
  std::__cxx11::string::~string((string *)&pos);
  return;
}

Assistant:

inline void showHelp( const CommandParser& parser ) {
        std::string exeName = parser.exeName();
        std::string::size_type pos = exeName.find_last_of( "/\\" );
        if( pos != std::string::npos ) {
            exeName = exeName.substr( pos+1 );
        }

        AllOptions options;
        Options::HelpOptionParser helpOpt;
        bool displayedSpecificOption = false;
        for( AllOptions::const_iterator it = options.begin(); it != options.end(); ++it ) {
            OptionParser& opt = **it;
            if( opt.find( parser ) && opt.optionNames() != helpOpt.optionNames() ) {
                displayedSpecificOption = true;
                std::cout   << "\n" << opt.optionNames() << " " << opt.argsSynopsis() << "\n\n"
                            << opt.optionSummary() << "\n\n"

                << addLineBreaks( opt.optionDescription(), 80, 2 ) << "\n" << std::endl;
            }
        }

        if( !displayedSpecificOption ) {
            std::cout << exeName << " is a CATCH host application. Options are as follows:\n\n";
            showUsage( std::cout );
        }
    }